

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O2

bool __thiscall trun::TestFunc::IsModuleMain(TestFunc *this)

{
  bool bVar1;
  __type_conflict4 _Var2;
  Config *pCVar3;
  
  bVar1 = IsGlobal(this);
  if (bVar1) {
    pCVar3 = Config::Instance();
    _Var2 = std::operator==(&this->caseName,&pCVar3->mainFuncName);
    return _Var2;
  }
  return false;
}

Assistant:

bool TestFunc::IsModuleMain() { {
    // FIXME: This is wrong.
    return (IsGlobal() && (caseName == Config::Instance().mainFuncName));
}}